

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

int evaluate_ab_partition_based_on_split
              (PC_TREE *pc_tree,PARTITION_TYPE rect_part,RD_RECT_PART_WIN_INFO *rect_part_win_info,
              int qindex,int split_idx1,int split_idx2)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar1 = qindex * -2 + 0x1fe;
  iVar3 = 3;
  if (iVar1 < 0xff) {
    iVar3 = (iVar1 / 0xff) * 3;
  }
  if (rect_part_win_info == (RD_RECT_PART_WIN_INFO *)0x0) {
    uVar4 = (uint)(pc_tree->partitioning == rect_part);
  }
  else if (rect_part == '\x01') {
    uVar4 = rect_part_win_info->rect_part_win[0];
  }
  else {
    uVar4 = rect_part_win_info->rect_part_win[1];
  }
  if (pc_tree->split[(uint)split_idx1] == (PC_TREE *)0x0) {
    uVar2 = 1;
  }
  else {
    uVar2 = (uint)(pc_tree->split[(uint)split_idx1]->partitioning == '\0');
  }
  if (pc_tree->split[(uint)split_idx2] == (PC_TREE *)0x0) {
    uVar5 = 1;
  }
  else {
    uVar5 = (uint)(pc_tree->split[(uint)split_idx2]->partitioning == '\0');
  }
  return (uint)(iVar3 <= (int)(uVar5 + ((uVar2 + 1) - (uint)(uVar4 == 0))));
}

Assistant:

static int evaluate_ab_partition_based_on_split(
    const PC_TREE *pc_tree, PARTITION_TYPE rect_part,
    const RD_RECT_PART_WIN_INFO *rect_part_win_info, int qindex, int split_idx1,
    int split_idx2) {
  int num_win = 0;
  // Threshold for number of winners
  // Conservative pruning for high quantizers
  const int num_win_thresh = AOMMIN(3 * (2 * (MAXQ - qindex) / MAXQ), 3);
  int sub_part_win =
      (rect_part_win_info == NULL)    ? (pc_tree->partitioning == rect_part)
      : (rect_part == PARTITION_HORZ) ? rect_part_win_info->rect_part_win[HORZ]
                                      : rect_part_win_info->rect_part_win[VERT];
  num_win += (sub_part_win) ? 1 : 0;
  if (pc_tree->split[split_idx1]) {
    num_win +=
        (pc_tree->split[split_idx1]->partitioning == PARTITION_NONE) ? 1 : 0;
  } else {
    num_win += 1;
  }
  if (pc_tree->split[split_idx2]) {
    num_win +=
        (pc_tree->split[split_idx2]->partitioning == PARTITION_NONE) ? 1 : 0;
  } else {
    num_win += 1;
  }
  if (num_win < num_win_thresh) {
    return 0;
  }
  return 1;
}